

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetSimpleJitExecutedIterations
          (FunctionExecutionStateMachine *this)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  ExecutionMode EVar5;
  undefined4 *puVar6;
  FunctionEntryPointInfo *pFVar7;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x136,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar4) goto LAB_006e4e50;
    *puVar6 = 0;
  }
  EVar5 = GetExecutionMode(this);
  if (EVar5 != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x137,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar4) goto LAB_006e4e50;
    *puVar6 = 0;
  }
  pFVar7 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  if (pFVar7 == (FunctionEntryPointInfo *)0x0) {
    return 0;
  }
  uVar2 = pFVar7->callsCount;
  uVar1 = this->simpleJitLimit;
  if (uVar1 == 0) {
    if (uVar2 == 0) {
      return 0;
    }
  }
  else if (uVar2 < uVar1) {
    if (uVar2 == 0) {
      return uVar1;
    }
    goto LAB_006e4e3b;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                              ,0x141,
                              "(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount)",
                              "simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount");
  if (!bVar4) {
LAB_006e4e50:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
  uVar1 = this->simpleJitLimit;
LAB_006e4e3b:
  return uVar1 + ~(ushort)uVar2;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetSimpleJitExecutedIterations() const
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);

        FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
        if (!simpleJitEntryPointInfo)
        {
            return 0;
        }

        // Simple JIT counts down and transitions on overflow
        const uint32 callCount = simpleJitEntryPointInfo->callsCount;
        Assert(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount);
        return callCount == 0 ?
            static_cast<uint16>(simpleJitLimit) :
            static_cast<uint16>(simpleJitLimit) - static_cast<uint16>(callCount) - 1;
    }